

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O3

void Am_Choice_List_Start_Do_proc(Am_Object *inter)

{
  anon_union_8_8_ea4c8939_for_value aVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Value *initial;
  Am_Wrapper *value;
  uint uVar4;
  Am_Choice_How_Set how_set;
  Am_Value old_ref;
  Am_Choice_How_Set local_30;
  Am_Value local_28;
  
  Am_Object::Set(inter,0x16b,0,0);
  Am_Object::Set(inter,0x16a,0,0);
  Am_Object::Set(inter,0x1ef,0,1);
  pAVar3 = Am_Object::Get(inter,0xd4,0);
  if ((pAVar3->type != 1) && (pAVar3->type != Am_Choice_How_Set::Am_Choice_How_Set_ID)) {
    Am_Choice_How_Set::TypeError(&local_30,pAVar3);
  }
  local_30.value = (long)(pAVar3->value).wrapper_value;
  if (local_30.value == Am_CHOICE_LIST_TOGGLE.value) {
    pAVar3 = Am_Object::Get(inter,0x11b,0);
    aVar1 = pAVar3->value;
    if ((aVar1.wrapper_value != (Am_Wrapper *)0x0) &&
       (pAVar3->type != Am_Input_Char::Am_Input_Char_ID)) {
      Am_Error();
    }
    initial = Am_Object::Get(inter,0x12e,1);
    pAVar3 = &local_28;
    Am_Value::Am_Value(pAVar3,initial);
    bVar2 = Am_Value::Exists(pAVar3);
    if (!bVar2) {
      pAVar3 = &Am_No_Value;
    }
    Am_Object::Set(inter,0x1f0,pAVar3,1);
    uVar4 = aVar1._0_4_;
    if ((uVar4 >> 0x10 & 1) == 0) {
      value = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
      Am_Object::Set(inter,0x12e,value,1);
    }
    if ((uVar4 >> 0x11 & 1) == 0) {
      clear_all_objects_selected(inter);
    }
    Am_Value::~Am_Value(&local_28);
  }
  else {
    clear_all_objects_selected(inter);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Choice_List_Start_Do,
                 (Am_Object inter))
{
  inter.Set(Am_OLD_INTERIM_VALUE, 0);
  inter.Set(Am_INTERIM_VALUE, 0);
  inter.Set(Am_LAST_USED_OLD_INTERIM_VALUE, 0, Am_OK_IF_NOT_THERE);
  Am_Choice_How_Set how_set = inter.Get(Am_HOW_SET);
  if (how_set == Am_CHOICE_LIST_TOGGLE) {
    Am_Input_Char ic = inter.Get(Am_START_CHAR);
    bool extend_from_orig = ic.shift;
    bool separate_extend = ic.control;
    Am_Value old_ref = inter.Peek(Am_INITIAL_REF_OBJECT);
    inter.Set(Am_LAST_INITIAL_REF_OBJECT,
              old_ref.Exists() ? old_ref : Am_No_Value, Am_OK_IF_NOT_THERE);
    if (!extend_from_orig)
      inter.Set(Am_INITIAL_REF_OBJECT, Am_No_Object, Am_OK_IF_NOT_THERE);
    if (!separate_extend)
      clear_all_objects_selected(inter);
  } else {
    clear_all_objects_selected(inter);
  }
}